

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O2

uint __thiscall
flatbuffers::FlatBufferBuilderImpl<true>::PushElement<unsigned_long,unsigned_int>
          (FlatBufferBuilderImpl<true> *this,unsigned_long element)

{
  unsigned_long local_18;
  
  Align(this,8);
  local_18 = element;
  vector_downward<unsigned_long>::push_small<unsigned_long>(&this->buf_,&local_18);
  return (int)(this->buf_).size_ - (int)this->length_of_64_bit_region_;
}

Assistant:

ReturnT PushElement(T element) {
    AssertScalarT<T>();
    Align(sizeof(T));
    buf_.push_small(EndianScalar(element));
    return CalculateOffset<ReturnT>();
  }